

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  value_type *this_00;
  int local_14;
  int i;
  ImGuiWindow *this_local;
  
  if (this->DrawList == &this->DrawListInst) {
    IM_DELETE<char>(this->Name);
    for (local_14 = 0; local_14 != (this->ColumnsStorage).Size; local_14 = local_14 + 1) {
      this_00 = ImVector<ImGuiColumnsSet>::operator[](&this->ColumnsStorage,local_14);
      ImGuiColumnsSet::~ImGuiColumnsSet(this_00);
    }
    ImDrawList::~ImDrawList(&this->DrawListInst);
    ImVector<ImGuiColumnsSet>::~ImVector(&this->ColumnsStorage);
    ImGuiStorage::~ImGuiStorage(&this->StateStorage);
    ImVector<unsigned_int>::~ImVector(&this->IDStack);
    ImGuiDrawContext::~ImGuiDrawContext(&this->DC);
    return;
  }
  __assert_fail("DrawList == &DrawListInst",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                ,0x7c2,"ImGuiWindow::~ImGuiWindow()");
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    for (int i = 0; i != ColumnsStorage.Size; i++)
        ColumnsStorage[i].~ImGuiColumnsSet();
}